

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
cmState::GetCacheEntryKeys_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,cmState *this)

{
  bool bVar1;
  int iVar2;
  pointer pcVar3;
  CacheIterator CVar4;
  string local_60;
  undefined1 local_40 [8];
  CacheIterator cit;
  cmState *this_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *definitions;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  pcVar3 = std::unique_ptr<cmCacheManager,_std::default_delete<cmCacheManager>_>::operator->
                     (&this->CacheManager);
  iVar2 = cmCacheManager::GetSize(pcVar3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(__return_storage_ptr__,(long)iVar2);
  pcVar3 = std::unique_ptr<cmCacheManager,_std::default_delete<cmCacheManager>_>::operator->
                     (&this->CacheManager);
  CVar4 = cmCacheManager::GetCacheIterator(pcVar3,(char *)0x0);
  cit.Container = (cmCacheManager *)CVar4.Position._M_node;
  local_40 = (undefined1  [8])CVar4.Container;
  cmCacheManager::CacheIterator::Begin((CacheIterator *)local_40);
  while (bVar1 = cmCacheManager::CacheIterator::IsAtEnd((CacheIterator *)local_40),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    cmCacheManager::CacheIterator::GetName_abi_cxx11_(&local_60,(CacheIterator *)local_40);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    cmCacheManager::CacheIterator::Next((CacheIterator *)local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> cmState::GetCacheEntryKeys() const
{
  std::vector<std::string> definitions;
  definitions.reserve(this->CacheManager->GetSize());
  cmCacheManager::CacheIterator cit = this->CacheManager->GetCacheIterator();
  for (cit.Begin(); !cit.IsAtEnd(); cit.Next()) {
    definitions.push_back(cit.GetName());
  }
  return definitions;
}